

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcode.c
# Opt level: O2

void luaK_self(FuncState *fs,expdesc *e,expdesc *key)

{
  ravi_type_map rVar1;
  int b;
  int a;
  int c;
  OpCode o;
  bool bVar2;
  
  if ((key->k == VK) && (key->ravi_type_map == 0x100)) {
    bVar2 = fs->f->k[(key->u).info].tt_ == 0x8004;
  }
  else {
    bVar2 = false;
  }
  luaK_exp2anyreg(fs,e);
  rVar1 = e->ravi_type_map;
  b = (e->u).info;
  freeexp(fs,e);
  *(uint *)&e->u = (uint)fs->freereg;
  e->k = VNONRELOC;
  luaK_reserveregs(fs,2);
  a = (e->u).info;
  o = OP_SELF;
  if (bVar2) {
    o = (uint)(rVar1 != 0x80) * 4 + OP_RAVI_TABLE_SELF_SK;
  }
  c = luaK_exp2RK(fs,key);
  luaK_codeABC(fs,o,a,b,c);
  freeexp(fs,key);
  return;
}

Assistant:

void luaK_self (FuncState *fs, expdesc *e, expdesc *key) {
  int ereg;
  /* Ravi extension:
     If we only know the key is a string constant
     we emit specialized bytecode OP_RAVI_SELF_SK
     If we also know that the variable is a table 
     then we emit OP_RAVI_TABLE_SELF_SK
  */
  int is_string_constant_key =
    key->k == VK &&
    key->ravi_type_map == RAVI_TM_STRING &&
    ttisshrstring(&fs->f->k[key->u.info]);
  luaK_exp2anyreg(fs, e);
  // The check below needs to be 
  // after exp2anyreg as this can modify e->ravi_type
  int table_and_string =
	  e->ravi_type_map == RAVI_TM_TABLE &&
	  is_string_constant_key;
  ereg = e->u.info;  /* register where 'e' was placed */
  freeexp(fs, e);
  e->u.info = fs->freereg;  /* base register for op_self */
  e->k = VNONRELOC;  /* self expression has a fixed register */
  luaK_reserveregs(fs, 2);  /* function and 'self' produced by op_self */
  luaK_codeABC(fs, table_and_string ? OP_RAVI_TABLE_SELF_SK : 
                                      (is_string_constant_key ? OP_RAVI_SELF_SK : OP_SELF), 
                                      e->u.info, ereg, luaK_exp2RK(fs, key));
  freeexp(fs, key);
}